

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_huge_container_count(void)

{
  size_t sVar1;
  roaring_bitmap_t *prVar2;
  uint8_t data [655378];
  char acStack_a0028 [8];
  char acStack_a0020 [655376];
  
  memset(acStack_a0028 + 8,0,0xa000a);
  sVar1 = roaring_bitmap_portable_deserialize_size(acStack_a0028,0xa0008);
  _assert_int_equal(sVar1,0xa0008,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                    ,0xca);
  sVar1 = roaring_bitmap_portable_deserialize_size(acStack_a0028,0xa0012);
  _assert_int_equal(sVar1,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                    ,0xd0);
  prVar2 = roaring_bitmap_portable_deserialize_safe(acStack_a0028,0xa0012);
  _assert_true((ulong)(prVar2 == (roaring_bitmap_t *)0x0),"bitmap",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
               ,0xd3);
  return;
}

Assistant:

DEFINE_TEST(deserialize_huge_container_count) {
    // clang-format off
    const uint8_t data_begin[] = {
        0x3A, 0x30, 0, 0,       // Serial Cookie No Run Container
        0x00, 0x00, 0x01, 0x00, // Container count (MAX_CONTAINERS + 1)
    };
    // clang-format on
#define EXTRA_DATA(num_containers) \
    ((num_containers) * (3 * sizeof(uint16_t) + sizeof(uint32_t)))

    // For each container, 32 bits for container offset,
    //   16 bits each for a key, cardinality - 1, and a value
    uint8_t data[sizeof(data_begin) + EXTRA_DATA(MAX_CONTAINERS + 1)];
    memcpy(data, data_begin, sizeof(data_begin));
    memset(data + sizeof(data_begin), 0, EXTRA_DATA(MAX_CONTAINERS + 1));

    size_t valid_size = sizeof(data_begin) + EXTRA_DATA(MAX_CONTAINERS);
    assert_int_equal(
        roaring_bitmap_portable_deserialize_size((const char*)data, valid_size),
        valid_size);

    // Add an extra container
    data[4] += 1;
    assert_int_equal(roaring_bitmap_portable_deserialize_size((const char*)data,
                                                              sizeof(data)),
                     0);
    roaring_bitmap_t* bitmap = roaring_bitmap_portable_deserialize_safe(
        (const char*)data, sizeof(data));
    assert_null(bitmap);
#undef EXTRA_DATA
}